

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> * __thiscall
kratos::GeneratorGraph::get_sorted_nodes
          (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__return_storage_ptr__
          ,GeneratorGraph *this)

{
  bool bVar1;
  size_type __n;
  reference ppGVar2;
  undefined1 local_68 [8];
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  queue;
  GeneratorGraph *this_local;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *result;
  
  queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  topological_sort((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                    *)local_68,this);
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
            (__return_storage_ptr__);
  __n = std::
        queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
        ::size((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                *)local_68);
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
            (__return_storage_ptr__,__n);
  while (bVar1 = std::
                 queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                 ::empty((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                          *)local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppGVar2 = std::
              queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
              ::front((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                       *)local_68);
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*&>
              ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
               __return_storage_ptr__,&(*ppGVar2)->generator);
    std::
    queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
    ::pop((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
           *)local_68);
  }
  std::
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  ::~queue((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
            *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Generator *> GeneratorGraph::get_sorted_nodes() {
    auto queue = topological_sort();
    std::vector<Generator *> result;
    result.reserve(queue.size());
    while (!queue.empty()) {
        result.emplace_back(queue.front()->generator);
        queue.pop();
    }
    return result;
}